

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  stbi_uc sVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  sVar1 = stbi__get8(z);
  lVar3 = 0;
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0018cb52:
      bVar4 = z->img_buffer < z->img_buffer_end;
    }
    else {
      iVar2 = (*(z->io).eof)(z->io_user_data);
      if (iVar2 != 0) {
        if (z->read_from_callbacks != 0) goto LAB_0018cb52;
        goto LAB_0018cbc9;
      }
      bVar4 = true;
    }
    if ((!bVar4) || (sVar1 == '\n')) goto LAB_0018cbc9;
    buffer[lVar3] = sVar1;
    if (lVar3 == 0x3fe) break;
    sVar1 = stbi__get8(z);
    lVar3 = lVar3 + 1;
  } while( true );
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0018cba7:
      if (z->img_buffer_end <= z->img_buffer) break;
    }
    else {
      iVar2 = (*(z->io).eof)(z->io_user_data);
      if (iVar2 != 0) {
        if (z->read_from_callbacks != 0) goto LAB_0018cba7;
        break;
      }
    }
    sVar1 = stbi__get8(z);
  } while (sVar1 != '\n');
  lVar3 = 0x3ff;
LAB_0018cbc9:
  buffer[lVar3] = '\0';
  return buffer;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}